

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O1

void sptk::snack::get_cand(Cross *cross,float *peak,int *loc,int nlags,int *ncand,float cand_thresh)

{
  float fVar1;
  float fVar2;
  short sVar3;
  float *pfVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  iVar5 = 0;
  if (3 < nlags) {
    fVar1 = cross->maxval;
    sVar3 = cross->firstlag;
    pfVar4 = cross->correl;
    lVar6 = 0;
    iVar5 = 0;
    fVar7 = *pfVar4;
    fVar8 = pfVar4[1];
    do {
      fVar2 = pfVar4[lVar6 + 2];
      if (((cand_thresh * fVar1 < fVar8) && (fVar2 <= fVar8)) && (fVar7 <= fVar8)) {
        *peak = fVar8;
        peak = peak + 1;
        *loc = sVar3 + 1 + (int)lVar6;
        loc = loc + 1;
        iVar5 = iVar5 + 1;
      }
      lVar6 = lVar6 + 1;
      fVar7 = fVar8;
      fVar8 = fVar2;
    } while (nlags + -3 != (int)lVar6);
  }
  *ncand = iVar5;
  return;
}

Assistant:

static void get_cand(Cross *cross, float *peak, int *loc, int nlags, int *ncand,
                     float cand_thresh)
#endif
{
  register int i, lastl, *t;
  register float o, p, q, *r, *s, clip;
#if 0
  int start, ncan, maxl;
#else
  int start, ncan;
#endif

  clip = (float) (cand_thresh * cross->maxval);
#if 0
  maxl = cross->maxloc;
#endif
  lastl = nlags - 2;
  start = cross->firstlag;

  r = cross->correl;
  o= *r++;			/* first point */
  q = *r++;	                /* middle point */
  p = *r++;
  s = peak;
  t = loc;
  ncan=0;
  for(i=1; i < lastl; i++, o=q, q=p, p= *r++){
    if((q > clip) &&		/* is this a high enough value? */
      (q >= p) && (q >= o)){ /* NOTE: this finds SHOLDERS and PLATEAUS
				      as well as peaks (is this a good idea?) */
	*s++ = q;		/* record the peak value */
	*t++ = i + start;	/* and its location */
	ncan++;			/* count number of peaks found */
      }
  }
/*
  o = q;
  q = p;
  if( (q > clip) && (q >=0)){
    *s++ = q;
    *t++ = i+start;
    ncan++;
  }
*/
  *ncand = ncan;
}